

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fhandle.h
# Opt level: O2

filehandle * __thiscall filehandle::operator=(filehandle *this,int fh)

{
  int __v;
  system_error *this_00;
  int *piVar1;
  error_category *__ecat;
  int fh_local;
  __shared_ptr<filehandle::ptr,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (fh != -1) {
    std::make_shared<filehandle::ptr,int&>((int *)&local_28);
    std::__shared_ptr<filehandle::ptr,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<filehandle::ptr,_(__gnu_cxx::_Lock_policy)2> *)this,&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    return this;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  piVar1 = __errno_location();
  __v = *piVar1;
  __ecat = (error_category *)std::_V2::generic_category();
  std::system_error::system_error(this_00,__v,__ecat);
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

filehandle& operator=(int fh)
    { 
        if (fh==-1)
            throw std::system_error(errno, std::generic_category());
        _p = std::make_shared<ptr>(fh);
        return *this;
    }